

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.cpp
# Opt level: O1

uint_least64_t anon_unknown.dwarf_aa1d::call_function(size_t n)

{
  int iVar1;
  int *piVar2;
  uint_least64_t uVar3;
  size_t sVar4;
  long *in_FS_OFFSET;
  scoped_profiler local_70;
  string local_68;
  collector *local_48;
  timespec local_40;
  
  if (n == 0) {
    uVar3 = 0;
  }
  else {
    local_48 = (collector *)(*in_FS_OFFSET + -0x58);
    sVar4 = 0;
    do {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        local_68.field_2._M_allocated_capacity = 0x6e6f6974636e7566;
        local_68._M_string_length = 8;
        local_68.field_2._M_local_buf[8] = '\0';
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        fp::collector::collector((collector *)(*in_FS_OFFSET + -0x58),&local_68);
        _GLOBAL__N_1::call_function();
      }
      fp::scoped_profiler::scoped_profiler(&local_70,local_48);
      local_40.tv_sec = 0;
      local_40.tv_nsec = 1000000;
      do {
        iVar1 = nanosleep(&local_40,&local_40);
        if (iVar1 != -1) break;
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
      uVar3 = fp::factorial(0x14);
      fp::collector::stop(local_70.m_collector);
      sVar4 = sVar4 + 1;
    } while (sVar4 != n);
  }
  return uVar3;
}

Assistant:

uint_least64_t call_function(size_t n)
{
  uint_least64_t result{0};

  for (size_t i = 0; i < n; ++i) {
    result = function(20);
    fp::keep(result); // avoid optimization
  }

  return result;
}